

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

void __thiscall
boost::ext::ut::v1_1_8::runner<ApprovalTests::cfg::reporter,_16>::filter::filter
          (filter *this,string_view filter)

{
  char *in_stack_00000038;
  undefined1 in_stack_00000040 [16];
  
  utility::split<std::basic_string_view<char,std::char_traits<char>>,char_const*>
            ((basic_string_view<char,_std::char_traits<char>_>)in_stack_00000040,in_stack_00000038);
  return;
}

Assistant:

constexpr /*explicit(false)*/ filter(std::string_view filter = {})
          : path_{utility::split(filter, delim)} {}